

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void getFileNames(string *path,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *files)

{
  pointer pcVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  char *__s1;
  string filename;
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = files;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      do {
        __s1 = pdVar3->d_name;
        iVar2 = strcmp(__s1,".");
        if (iVar2 != 0) {
          iVar2 = strcmp(__s1,"..");
          if (iVar2 != 0) {
            local_78[0] = local_68;
            sVar4 = strlen(__s1);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_78,__s1,__s1 + sVar4);
            local_98[0] = local_88;
            pcVar1 = (path->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_98,pcVar1,pcVar1 + path->_M_string_length);
            std::__cxx11::string::append((char *)local_98);
            plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_98,(ulong)local_78[0]);
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_58.field_2._M_allocated_capacity = *psVar7;
              local_58.field_2._8_8_ = plVar5[3];
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            }
            else {
              local_58.field_2._M_allocated_capacity = *psVar7;
              local_58._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_58._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38
                       ,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (local_98[0] != local_88) {
              operator_delete(local_98[0],local_88[0] + 1);
            }
            if (local_78[0] != local_68) {
              operator_delete(local_78[0],local_68[0] + 1);
            }
          }
        }
        pdVar3 = readdir(__dirp);
      } while (pdVar3 != (dirent *)0x0);
    }
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Folder doesn\'t Exist!");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(-1);
}

Assistant:

void getFileNames(std::string path, std::vector<std::string>& files)
{
	DIR* pDir;
	struct dirent* ptr;
	if (!(pDir = opendir(path.c_str()))) {
		std::cout << "Folder doesn't Exist!" << std::endl;
		exit(-1);
	}
	while ((ptr = readdir(pDir)) != 0) {
		if (strcmp(ptr->d_name, ".") != 0 && strcmp(ptr->d_name, "..") != 0) {
			std::string filename(ptr->d_name);
			files.push_back(path + "/" + filename);
		}
	}
}